

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shmobject.hpp
# Opt level: O1

void __thiscall
CorUnix::CSharedMemoryObject::CSharedMemoryObject
          (CSharedMemoryObject *this,CObjectType *pot,CRITICAL_SECTION *pcsObjListLock)

{
  (this->super_CPalObjectBase).m_lRefCount = 1;
  (this->super_CPalObjectBase).m_pvImmutableData = (VOID *)0x0;
  (this->super_CPalObjectBase).m_pvLocalData = (VOID *)0x0;
  (this->super_CPalObjectBase).m_pot = pot;
  (this->super_CPalObjectBase).m_oa.sObjectName.m_pwsz = (WCHAR *)0x0;
  (this->super_CPalObjectBase).m_oa.sObjectName.m_dwStringLength = 0;
  (this->super_CPalObjectBase).m_oa.sObjectName.m_dwMaxLength = 0;
  (this->super_CPalObjectBase).m_oa.pSecurityAttributes = (LPSECURITY_ATTRIBUTES)0x0;
  (this->super_CPalObjectBase).m_sdlLocalData.super_IDataLock._vptr_IDataLock =
       (_func_int **)&PTR_ReleaseLock_00188780;
  (this->super_CPalObjectBase).m_sdlLocalData.m_fInitialized = false;
  (this->super_CPalObjectBase).m_pthrCleanup = (CPalThread *)0x0;
  (this->super_CPalObjectBase).super_IPalObject._vptr_IPalObject =
       (_func_int **)&PTR_GetObjectType_00188ac8;
  this->m_pcsObjListLock = pcsObjListLock;
  this->m_shmod = 0;
  this->m_pvSharedData = (VOID *)0x0;
  (this->m_ssmlSharedData).super_IDataLock._vptr_IDataLock = (_func_int **)&PTR_ReleaseLock_00188868
  ;
  (this->m_sdlSharedData).super_IDataLock._vptr_IDataLock = (_func_int **)&PTR_ReleaseLock_00188780;
  (this->m_sdlSharedData).m_fInitialized = false;
  this->m_ObjectDomain = ProcessLocalObject;
  this->m_fSharedDataDereferenced = 0;
  this->m_fDeleteSharedData = 0;
  (this->m_le).Blink = &this->m_le;
  (this->m_le).Flink = &this->m_le;
  return;
}

Assistant:

CSharedMemoryObject(
            CObjectType *pot,
            CRITICAL_SECTION *pcsObjListLock
            )
            :
            CPalObjectBase(pot),
            m_pcsObjListLock(pcsObjListLock),
            m_shmod(SHMNULL),
            m_pvSharedData(NULL),
            m_ObjectDomain(ProcessLocalObject),
            m_fSharedDataDereferenced(FALSE),
            m_fDeleteSharedData(FALSE)
        {
            InitializeListHead(&m_le);
        }